

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O0

void __thiscall FZipLump::SetLumpAddress(FZipLump *this)

{
  FileReader *pFVar1;
  FileReader *file;
  undefined1 local_2e [2];
  int skiplen;
  FZipLocalFileHeader localHeader;
  FZipLump *this_local;
  
  pFVar1 = ((this->super_FResourceLump).Owner)->Reader;
  localHeader._22_8_ = this;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(long)this->Position,0);
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,local_2e,0x1e);
  this->Position =
       this->Position +
       (uint)(ushort)localHeader.CompressedSize + (uint)localHeader.CompressedSize._2_2_ + 0x1e;
  (this->super_FResourceLump).Flags = (this->super_FResourceLump).Flags & 0x7f;
  return;
}

Assistant:

void FZipLump::SetLumpAddress()
{
	// This file is inside a zip and has not been opened before.
	// Position points to the start of the local file header, which we must
	// read and skip so that we can get to the actual file data.
	FZipLocalFileHeader localHeader;
	int skiplen;

	FileReader *file = Owner->Reader;

	file->Seek(Position, SEEK_SET);
	file->Read(&localHeader, sizeof(localHeader));
	skiplen = LittleShort(localHeader.NameLength) + LittleShort(localHeader.ExtraLength);
	Position += sizeof(localHeader) + skiplen;
	Flags &= ~LUMPFZIP_NEEDFILESTART;
}